

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::GenerateLdFuncObj(Lowerer *this,Instr *instr)

{
  Opnd *local_28;
  Opnd *functionObjOpnd;
  Opnd *dstOpnd;
  Instr *instr_local;
  Lowerer *this_local;
  
  dstOpnd = (Opnd *)instr;
  instr_local = (Instr *)this;
  functionObjOpnd = IR::Instr::GetDst(instr);
  local_28 = (Opnd *)0x0;
  LowererMD::LoadFunctionObjectOpnd(&this->m_lowererMD,(Instr *)dstOpnd,&local_28);
  InsertMove(functionObjOpnd,local_28,(Instr *)dstOpnd,true);
  IR::Instr::Remove((Instr *)dstOpnd);
  return;
}

Assistant:

void
Lowerer::GenerateLdFuncObj(IR::Instr* instr)
{
    //  MOV dst, functionObject  // functionObject through stack params or src1

    IR::Opnd *dstOpnd = instr->GetDst();
    IR::Opnd *functionObjOpnd = nullptr;

    m_lowererMD.LoadFunctionObjectOpnd(instr, functionObjOpnd);
    Lowerer::InsertMove(dstOpnd, functionObjOpnd, instr);
    instr->Remove();
}